

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  ulong uVar1;
  ulong uVar2;
  SerialArena *this_00;
  undefined8 *puVar3;
  Memory MVar4;
  size_t space_allocated;
  size_t local_18;
  
  for (this_00 = *(SerialArena **)(this + 0x10); this_00 != (SerialArena *)0x0;
      this_00 = this_00->next_) {
    SerialArena::CleanupList(this_00);
  }
  local_18 = 0;
  MVar4 = Free(this,&local_18);
  uVar1 = *(ulong *)(this + 8);
  uVar2 = uVar1 & 0xfffffffffffffff8;
  if (uVar2 == 0) {
    if ((uVar1 & 1) != 0) {
      return;
    }
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = *(undefined8 **)(uVar2 + 0x20);
    if ((uVar1 & 1) != 0) goto LAB_0035f584;
    if (*(code **)(uVar2 + 0x18) != (code *)0x0) {
      (**(code **)(uVar2 + 0x18))(MVar4.ptr,MVar4.size);
      goto LAB_0035f584;
    }
  }
  operator_delete(MVar4.ptr);
LAB_0035f584:
  local_18 = MVar4.size + local_18;
  if (puVar3 != (undefined8 *)0x0) {
    (**(code **)*puVar3)(puVar3,local_18);
  }
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  size_t space_allocated = 0;
  auto mem = Free(&space_allocated);

  // Policy is about to get deleted.
  auto* p = alloc_policy_.get();
  ArenaMetricsCollector* collector = p ? p->metrics_collector : nullptr;

  if (alloc_policy_.is_user_owned_initial_block()) {
    space_allocated += mem.size;
  } else {
    GetDeallocator(alloc_policy_.get(), &space_allocated)(mem);
  }

  if (collector) collector->OnDestroy(space_allocated);
}